

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3InitVtab(int isCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  char cVar1;
  ushort uVar2;
  Fts3Index *pFVar3;
  byte bVar4;
  sqlite3 *db_00;
  int iVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 *puVar9;
  void *__s;
  long lVar10;
  char *pcVar11;
  undefined8 extraout_RAX;
  undefined8 uVar12;
  char *pcVar13;
  Fts3Table *pFVar14;
  char *pcVar15;
  char cVar16;
  long lVar17;
  uchar uVar18;
  uint uVar19;
  int *piVar20;
  char *pcVar21;
  char **ppcVar22;
  uchar uVar23;
  int iVar24;
  Fts3Hash *pFVar25;
  ulong uVar26;
  sqlite3_stmt *psVar27;
  undefined8 *__dest;
  u64 uVar28;
  char *p;
  ulong uVar29;
  undefined1 uVar30;
  bool bVar31;
  int n;
  sqlite3_tokenizer *pTokenizer;
  int local_e4;
  undefined8 *local_e0;
  char *local_d8;
  Fts3Table *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  sqlite3_stmt *local_a8;
  Fts3Hash *local_a0;
  sqlite3_stmt *local_98;
  char *local_90;
  char *local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  char **local_68;
  sqlite3_tokenizer *local_60;
  undefined8 local_58;
  size_t local_50;
  int local_44;
  sqlite3 *local_40;
  sqlite3_vtab **local_38;
  
  local_e4 = 0;
  cVar1 = (*argv)[3];
  local_60 = (sqlite3_tokenizer *)0x0;
  local_a0 = (Fts3Hash *)pAux;
  local_40 = db;
  local_38 = ppVTab;
  sVar7 = strlen(argv[1]);
  sVar8 = strlen(argv[2]);
  iVar5 = sqlite3_initialize();
  local_78 = 0;
  if (iVar5 == 0) {
    uVar28 = (long)argc * 8 - 0x10;
    local_80 = sVar7;
    local_68 = argv;
    local_50 = sVar8;
    puVar9 = (undefined8 *)sqlite3Malloc(uVar28);
    if (puVar9 == (undefined8 *)0x0) goto LAB_001bb325;
    memset(puVar9,0,uVar28);
    iVar5 = sqlite3_initialize();
    local_e0 = puVar9;
    if ((iVar5 == 0) && (local_44 = isCreate, __s = sqlite3Malloc(uVar28), __s != (void *)0x0)) {
      memset(__s,0,uVar28);
      if (3 < argc) {
        local_98 = (sqlite3_stmt *)(ulong)(uint)argc;
        psVar27 = (sqlite3_stmt *)0x3;
        iVar5 = 0;
        local_70 = local_70 & 0xffffffff00000000;
        local_78 = 0;
        local_88 = (char *)0x0;
        local_90 = (char *)0x0;
        pcVar11 = (char *)0x0;
        local_c8 = (char *)0x0;
        local_b8 = (char *)0x0;
        local_58 = 0;
        local_c0 = (char *)0x0;
        local_d0 = (Fts3Table *)0x0;
LAB_001bb501:
        pcVar15 = local_68[(long)psVar27];
        if ((local_60 == (sqlite3_tokenizer *)0x0) &&
           (sVar7 = strlen(pcVar15), pcVar15 != (char *)0x0 && 8 < sVar7)) {
          lVar10 = 0;
          do {
            if ((ulong)(byte)pcVar15[lVar10] == 0) {
              uVar18 = ""[(byte)"fts3tokenize"[lVar10 + 4]];
              uVar23 = '\0';
LAB_001bb586:
              if (uVar23 != uVar18) goto LAB_001bb5a8;
              break;
            }
            uVar23 = ""[(byte)pcVar15[lVar10]];
            uVar18 = ""[(byte)"fts3tokenize"[lVar10 + 4]];
            if (uVar23 != uVar18) goto LAB_001bb586;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          if (((long)pcVar15[8] < 0) || (sqlite3Fts3IsIdChar_isFtsIdChar[pcVar15[8]] != '\0'))
          goto LAB_001bb5a8;
          iVar5 = sqlite3Fts3InitTokenizer(local_a0,pcVar15 + 9,&local_60,pzErr);
          puVar9 = local_e0;
          iVar6 = iVar5;
          local_e4 = iVar5;
        }
        else {
LAB_001bb5a8:
          local_d8 = pcVar11;
          if (cVar1 == '4') {
            for (lVar10 = 0; pcVar15[lVar10] != '\0'; lVar10 = lVar10 + 1) {
              if (pcVar15[lVar10] == '=') {
                pcVar11 = sqlite3_mprintf("%s",pcVar15 + lVar10 + 1);
                if (pcVar11 == (char *)0x0) {
                  local_e4 = 7;
                  pcVar11 = local_d8;
                  p = local_c8;
                  goto LAB_001bc188;
                }
                local_b0 = pcVar11;
                sqlite3Fts3Dequote(pcVar11);
                piVar20 = &DAT_0020d968;
                uVar26 = 0;
                goto LAB_001bb646;
              }
            }
          }
          sVar7 = strlen(pcVar15);
          local_d0 = (Fts3Table *)(ulong)((int)local_d0 + (int)sVar7 + 1);
          iVar6 = (int)local_c0;
          local_c0 = (char *)(ulong)(iVar6 + 1);
          local_e0[iVar6] = pcVar15;
          pcVar11 = local_d8;
          puVar9 = local_e0;
          iVar6 = 0;
        }
        goto LAB_001bb6b1;
      }
      local_78 = 0;
      uVar30 = 1;
      local_88 = (char *)0x0;
      local_90 = (char *)0x0;
      pcVar15 = (char *)0x0;
      local_58 = 0;
      local_c8 = (char *)0x0;
      pcVar11 = (char *)0x0;
      iVar5 = (int)local_80;
      pFVar25 = local_a0;
      goto LAB_001bb9b6;
    }
  }
  else {
LAB_001bb325:
    local_e0 = (undefined8 *)0x0;
  }
  local_e4 = 7;
  __s = (void *)0x0;
  local_d0 = (Fts3Table *)0x0;
  pcVar15 = (char *)0x0;
  pcVar13 = (char *)0x0;
  pcVar11 = (char *)0x0;
  psVar27 = (sqlite3_stmt *)0x0;
  pcVar21 = (char *)0x0;
  p = (char *)0x0;
LAB_001bb351:
  sqlite3_free(pcVar15);
  sqlite3_free(psVar27);
  sqlite3_free(p);
  sqlite3_free(pcVar11);
  sqlite3_free(pcVar13);
  sqlite3_free(pcVar21);
  if (0 < (int)local_78) {
    uVar29 = local_78 & 0xffffffff;
    uVar26 = 0;
    do {
      sqlite3_free(*(void **)((long)__s + uVar26 * 8));
      uVar26 = uVar26 + 1;
    } while (uVar29 != uVar26);
  }
  sqlite3_free(local_e0);
  sqlite3_free(__s);
  iVar5 = local_e4;
  if (local_e4 == 0) {
    *local_38 = &local_d0->base;
  }
  else if (local_d0 == (Fts3Table *)0x0) {
    if (local_60 != (sqlite3_tokenizer *)0x0) {
      (*local_60->pModule->xDestroy)(local_60);
    }
  }
  else {
    fts3DisconnectMethod(&local_d0->base);
  }
  return iVar5;
  while( true ) {
    uVar26 = uVar26 + 1;
    piVar20 = piVar20 + 4;
    if (uVar26 == 8) break;
LAB_001bb646:
    if ((*piVar20 == (int)lVar10) &&
       (iVar5 = sqlite3_strnicmp(pcVar15,*(char **)(piVar20 + -2),(int)lVar10), pcVar13 = local_b0,
       iVar5 == 0)) {
      switch(uVar26 & 0xffffffff) {
      case 0:
        sVar7 = strlen(local_b0);
        pcVar11 = local_d8;
        puVar9 = local_e0;
        if (sVar7 != 4) goto LAB_001bb93b;
        lVar10 = 0;
        goto LAB_001bb714;
      case 1:
        sqlite3_free(local_b8);
        pcVar13 = (char *)0x0;
        local_b8 = local_b0;
        puVar9 = local_e0;
        pcVar11 = local_d8;
        goto LAB_001bb6a0;
      case 2:
        sqlite3_free(local_c8);
        pcVar13 = (char *)0x0;
        local_c8 = local_b0;
        puVar9 = local_e0;
        pcVar11 = local_d8;
        goto LAB_001bb6a0;
      case 3:
        sqlite3_free(local_d8);
        puVar9 = local_e0;
        pcVar13 = (char *)0x0;
        pcVar11 = local_b0;
        goto LAB_001bb6a0;
      case 4:
        sVar7 = strlen(local_b0);
        pcVar11 = local_d8;
        puVar9 = local_e0;
        if (sVar7 == 3) {
          lVar10 = 0;
          pcVar15 = "asc";
          goto LAB_001bb8af;
        }
        pcVar15 = "desc";
        if (sVar7 != 4) goto LAB_001bb8f0;
        lVar10 = 0;
        goto LAB_001bb7b6;
      case 5:
        sqlite3_free(local_90);
        pcVar13 = (char *)0x0;
        local_90 = local_b0;
        puVar9 = local_e0;
        pcVar11 = local_d8;
        goto LAB_001bb6a0;
      case 6:
        sqlite3_free(local_88);
        pcVar13 = (char *)0x0;
        local_88 = local_b0;
        puVar9 = local_e0;
        pcVar11 = local_d8;
        goto LAB_001bb6a0;
      case 7:
        iVar5 = (int)local_78;
        local_78 = (ulong)(iVar5 + 1);
        *(char **)((long)__s + (long)iVar5 * 8) = local_b0;
        pcVar13 = (char *)0x0;
        puVar9 = local_e0;
        pcVar11 = local_d8;
        goto LAB_001bb6a0;
      }
      break;
    }
  }
  sqlite3Fts3ErrMsg(pzErr,"unrecognized parameter: %s",pcVar15);
  local_e4 = 1;
  puVar9 = local_e0;
  pcVar13 = local_b0;
  pcVar11 = local_d8;
  goto LAB_001bb6a0;
  while( true ) {
    uVar23 = ""[(byte)pcVar13[lVar10]];
    uVar18 = ""[(byte)"asc"[lVar10]];
    if (uVar23 != uVar18) goto LAB_001bb8e9;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3) break;
LAB_001bb8af:
    if ((ulong)(byte)pcVar13[lVar10] == 0) goto LAB_001bb8d9;
  }
  uVar12 = 0;
  goto LAB_001bb911;
  while( true ) {
    uVar23 = ""[(byte)pcVar13[lVar10]];
    uVar18 = ""[(byte)"route_desc"[lVar10 + 6]];
    if (uVar23 != uVar18) goto LAB_001bb8e9;
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) break;
LAB_001bb7b6:
    if ((ulong)(byte)pcVar13[lVar10] == 0) goto LAB_001bb8d9;
  }
  uVar12 = 0;
LAB_001bb911:
  uVar26 = CONCAT71((int7)((ulong)uVar12 >> 8),*pcVar13) & 0xffffffffffffffdf;
  local_58 = CONCAT71((int7)(uVar26 >> 8),(char)uVar26 == 'D');
LAB_001bb6a0:
  sqlite3_free(pcVar13);
  iVar5 = local_e4;
  iVar6 = local_e4;
LAB_001bb6b1:
  pFVar25 = local_a0;
  if ((iVar6 != 0) || (psVar27 = psVar27 + 1, local_98 <= psVar27)) goto LAB_001bba82;
  goto LAB_001bb501;
LAB_001bb8d9:
  uVar18 = ""[(byte)pcVar15[lVar10]];
  uVar23 = '\0';
LAB_001bb8e9:
  uVar12 = 0;
  if (uVar23 != uVar18) {
LAB_001bb8f0:
    sqlite3Fts3ErrMsg(pzErr,"unrecognized order: %s",pcVar13);
    local_e4 = 1;
    uVar12 = extraout_RAX;
  }
  goto LAB_001bb911;
  while( true ) {
    uVar23 = ""[(byte)pcVar13[lVar10]];
    uVar18 = ""[(byte)"RELEASE fts3"[lVar10 + 8]];
    if (uVar23 != uVar18) goto LAB_001bb934;
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) break;
LAB_001bb714:
    if ((ulong)(byte)pcVar13[lVar10] == 0) {
      uVar18 = ""[(byte)"RELEASE fts3"[lVar10 + 8]];
      uVar23 = '\0';
LAB_001bb934:
      if (uVar23 != uVar18) {
LAB_001bb93b:
        sqlite3Fts3ErrMsg(pzErr,"unrecognized matchinfo: %s",pcVar13);
        local_e4 = 1;
      }
      break;
    }
  }
  local_70 = CONCAT44(local_70._4_4_,1);
  goto LAB_001bb6a0;
LAB_001bba82:
  uVar30 = (int)local_70 == 0;
  if ((iVar6 == 0) && (local_90 != (char *)0x0)) {
    sqlite3_free(local_c8);
    sqlite3_free(pcVar11);
    if ((uint)local_c0 == 0) {
      sqlite3_free(puVar9);
      local_a8 = (sqlite3_stmt *)0x0;
      pcVar11 = sqlite3_mprintf("SELECT * FROM %Q.%Q",local_68[1],local_90);
      db_00 = local_40;
      if (pcVar11 == (char *)0x0) {
        iVar5 = 7;
      }
      else {
        iVar5 = sqlite3LockAndPrepare(local_40,pcVar11,-1,0,(Vdbe *)0x0,&local_a8,(char **)0x0);
        if (iVar5 == 0) {
          local_b0 = (char *)CONCAT71(local_b0._1_7_,uVar30);
          sqlite3_free(pcVar11);
          psVar27 = local_a8;
          bVar4 = 1;
          if (local_a8 == (sqlite3_stmt *)0x0) {
            local_d0 = (Fts3Table *)0x0;
            pcVar11 = (char *)0x0;
            pFVar14 = local_d0;
          }
          else {
            uVar2 = *(ushort *)(local_a8 + 0xc0);
            pcVar11 = (char *)(ulong)uVar2;
            if (uVar2 == 0) {
              pcVar11 = (char *)0x0;
              local_d0 = (Fts3Table *)0x0;
              pFVar14 = local_d0;
            }
            else {
              pFVar14 = (Fts3Table *)0x0;
              uVar19 = 0;
              bVar4 = 0;
              do {
                pcVar15 = (char *)columnName(psVar27,uVar19,0,0);
                sVar7 = strlen(pcVar15);
                pFVar14 = (Fts3Table *)((long)pFVar14 + sVar7 + 1);
                uVar19 = uVar19 + 1;
              } while (uVar2 != uVar19);
            }
          }
          local_d0 = pFVar14;
          local_c0 = pcVar11;
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            puVar9 = (undefined8 *)sqlite3Malloc((long)local_d0 + (long)pcVar11 * 8);
            iVar5 = 0;
            if (puVar9 == (undefined8 *)0x0) {
              iVar5 = 7;
            }
            local_e0 = puVar9;
            if (!(bool)(bVar4 | puVar9 == (undefined8 *)0x0)) {
              __dest = puVar9 + (long)pcVar11;
              iVar5 = 0;
              pcVar15 = (char *)0x0;
              local_98 = psVar27;
              local_d8 = pcVar11;
              do {
                pcVar11 = (char *)columnName(local_98,(int)pcVar15,0,0);
                sVar7 = strlen(pcVar11);
                sVar7 = (long)((sVar7 << 0x20) + 0x100000000) >> 0x20;
                memcpy(__dest,pcVar11,sVar7);
                local_e0[(long)pcVar15] = __dest;
                __dest = (undefined8 *)((long)__dest + sVar7);
                pcVar15 = pcVar15 + 1;
                puVar9 = local_e0;
                pcVar11 = local_d8;
                psVar27 = local_98;
              } while (local_d8 != pcVar15);
            }
          }
          else {
            iVar5 = 7;
            puVar9 = (undefined8 *)0x0;
          }
          sqlite3_finalize(psVar27);
          pcVar13 = local_88;
          local_c8 = (char *)0x0;
          pFVar25 = local_a0;
          local_e4 = iVar5;
          uVar30 = (byte)local_b0;
          if ((iVar5 == 0) && (local_88 != (char *)0x0)) {
            pcVar15 = local_b8;
            if ((uint)local_c0 != 0) {
              pcVar21 = (char *)0x0;
LAB_001bc627:
              if (((char *)puVar9[(long)pcVar21] == (char *)0x0) ||
                 (iVar5 = sqlite3StrICmp(pcVar13,(char *)puVar9[(long)pcVar21]), pcVar15 = local_b8,
                 iVar5 != 0)) goto LAB_001bc644;
              if ((uint)pcVar21 < (uint)local_c0) {
                do {
                  puVar9[(long)pcVar21] = puVar9[(long)(pcVar21 + 1)];
                  pcVar21 = pcVar21 + 1;
                } while (pcVar11 != pcVar21);
              }
              pcVar11 = (char *)(ulong)((uint)local_c0 - 1);
LAB_001bc6cf:
              local_c0 = pcVar11;
              local_c8 = (char *)0x0;
              pcVar11 = (char *)0x0;
              pFVar25 = local_a0;
              uVar30 = (byte)local_b0;
              goto LAB_001bc6d8;
            }
            local_c8 = (char *)0x0;
            pcVar11 = (char *)0x0;
            iVar5 = (int)local_80;
            goto LAB_001bb9b6;
          }
          pcVar11 = (char *)0x0;
          goto LAB_001bbc6c;
        }
        pcVar15 = sqlite3_errmsg(db_00);
        sqlite3Fts3ErrMsg(pzErr,"%s",pcVar15);
      }
      sqlite3_free(pcVar11);
      local_e0 = (undefined8 *)0x0;
      pcVar11 = (char *)0x0;
      p = (char *)0x0;
      local_e4 = iVar5;
LAB_001bc188:
      local_d0 = (Fts3Table *)0x0;
      psVar27 = (sqlite3_stmt *)0x0;
      pcVar15 = local_b8;
      pcVar13 = local_90;
      pcVar21 = local_88;
      goto LAB_001bb351;
    }
    local_c8 = (char *)0x0;
    pcVar11 = (char *)0x0;
    iVar5 = local_e4;
  }
LAB_001bbc6c:
  pcVar15 = local_b8;
  local_e0 = puVar9;
  if (iVar5 != 0) {
LAB_001bbc79:
    local_d0 = (Fts3Table *)0x0;
    pcVar13 = local_90;
    psVar27 = (sqlite3_stmt *)0x0;
    pcVar21 = local_88;
    p = local_c8;
    goto LAB_001bb351;
  }
LAB_001bc6d8:
  iVar5 = (int)local_80;
  if ((uint)local_c0 == 0) {
LAB_001bb9b6:
    *puVar9 = "content";
    local_c0 = (char *)0x1;
    local_d0 = (Fts3Table *)0x8;
  }
  local_e0 = puVar9;
  if (local_60 == (sqlite3_tokenizer *)0x0) {
    local_e4 = sqlite3Fts3InitTokenizer(pFVar25,"simple",&local_60,pzErr);
    iVar5 = (int)local_80;
    if (local_e4 != 0) goto LAB_001bbc79;
    local_e4 = 0;
  }
  local_b0 = (char *)CONCAT71(local_b0._1_7_,uVar30);
  uVar26 = 1;
  if ((pcVar15 != (char *)0x0) && (cVar16 = *pcVar15, cVar16 != '\0')) {
    uVar26 = 2;
    pcVar13 = pcVar15;
    do {
      pcVar13 = pcVar13 + 1;
      if (cVar16 == ',') {
        uVar26 = (ulong)((int)uVar26 + 1);
      }
      else if (cVar16 == '\0') break;
      cVar16 = *pcVar13;
    } while( true );
  }
  local_b8 = pcVar15;
  iVar6 = sqlite3_initialize();
  if (iVar6 == 0) {
    uVar28 = (long)(int)uVar26 * 0x28;
    local_98 = (sqlite3_stmt *)sqlite3Malloc(uVar28);
    pcVar15 = local_b8;
    if (local_98 == (sqlite3_stmt *)0x0) {
      iVar5 = (int)local_80;
      goto LAB_001bba49;
    }
    bVar31 = local_b8 != (char *)0x0;
    local_d8 = pcVar11;
    memset(local_98,0,uVar28);
    pcVar11 = local_d8;
    iVar5 = (int)local_80;
    local_e4 = 0;
    if (1 < (int)uVar26 && bVar31) {
      iVar6 = 1;
      do {
        cVar16 = *pcVar15;
        if (9 < (byte)(cVar16 - 0x30U)) {
LAB_001bc123:
          local_e4 = 1;
          uVar26 = 0;
          sqlite3Fts3ErrMsg(pzErr,"error parsing prefix parameter: %s",local_b8);
          goto LAB_001bba50;
        }
        lVar10 = 0;
        iVar24 = 0;
        do {
          iVar24 = (uint)(byte)(cVar16 - 0x30) + iVar24 * 10;
          if (10000000 < iVar24) {
            if (lVar10 == 0) goto LAB_001bc123;
            pcVar15 = pcVar15 + lVar10;
            goto LAB_001bbc00;
          }
          cVar16 = pcVar15[lVar10 + 1];
          lVar10 = lVar10 + 1;
        } while ((byte)(cVar16 - 0x30U) < 10);
        pcVar15 = pcVar15 + lVar10;
        if (iVar24 == 0) {
LAB_001bbc00:
          uVar26 = (ulong)((int)uVar26 - 1);
        }
        else {
          *(int *)(local_98 + (long)iVar6 * 0x28) = iVar24;
          iVar6 = iVar6 + 1;
        }
        pcVar15 = pcVar15 + 1;
      } while (iVar6 < (int)uVar26);
      local_e4 = 0;
    }
  }
  else {
LAB_001bba49:
    local_98 = (sqlite3_stmt *)0x0;
    uVar26 = 0;
    local_e4 = 7;
  }
LAB_001bba50:
  if (local_e4 != 0) {
    local_d0 = (Fts3Table *)0x0;
    pcVar15 = local_b8;
    pcVar13 = local_90;
    psVar27 = local_98;
    pcVar21 = local_88;
    p = local_c8;
    goto LAB_001bb351;
  }
  local_d8 = pcVar11;
  iVar6 = sqlite3_initialize();
  if (iVar6 == 0) {
    iVar6 = (uint)local_c0;
    lVar10 = (long)(int)(uint)local_c0;
    iVar24 = (int)uVar26;
    local_70 = (ulong)iVar24;
    local_80 = (size_t)((int)local_50 + 1);
    local_a0 = (Fts3Hash *)(long)(iVar5 + 1);
    uVar28 = (long)local_a0 + local_70 * 0x28 + (long)(int)local_d0 + lVar10 * 9 + local_80 + 0x208;
    local_50 = local_70 * 0x28;
    pFVar14 = (Fts3Table *)sqlite3Malloc(uVar28);
    if (pFVar14 != (Fts3Table *)0x0) {
      memset(pFVar14,0,uVar28);
      bVar31 = cVar1 == '4';
      pFVar14->db = local_40;
      pFVar14->nColumn = iVar6;
      pFVar14->nPendingData = 0;
      pFVar14->azColumn = (char **)(pFVar14 + 1);
      pFVar14->pTokenizer = local_60;
      pFVar14->nMaxPendingData = 0x100000;
      pFVar14->bHasStat = bVar31;
      pFVar14->bFts4 = bVar31;
      pFVar14->bHasDocsize = bVar31 & (byte)local_b0;
      pFVar14->bDescIdx = (u8)local_58;
      pFVar14->nAutoincrmerge = 0xff;
      pFVar14->zContentTbl = local_90;
      pFVar14->zLanguageid = local_88;
      pFVar14->aIndex = (Fts3Index *)(pFVar14[1].aStmt + lVar10 + -0xd);
      memcpy((Fts3Index *)(pFVar14[1].aStmt + lVar10 + -0xd),local_98,local_50);
      ppcVar22 = local_68;
      sVar7 = local_80;
      pFVar14->nIndex = iVar24;
      if (0 < iVar24) {
        lVar17 = 0;
        do {
          pFVar3 = pFVar14->aIndex;
          *(undefined2 *)(&(pFVar3->hPending).keyClass + lVar17) = 0x101;
          *(undefined8 *)((long)&(pFVar3->hPending).ht + lVar17) = 0;
          puVar9 = (undefined8 *)((long)&(pFVar3->hPending).count + lVar17);
          *puVar9 = 0;
          puVar9[1] = 0;
          lVar17 = lVar17 + 0x28;
        } while (uVar26 * 0x28 != lVar17);
      }
      pFVar14->abNotindexed = (u8 *)(pFVar14->aIndex + local_70);
      pcVar11 = (char *)((long)&pFVar14->aIndex[local_70].nPrefix + lVar10);
      pFVar14->zName = pcVar11;
      local_d0 = pFVar14;
      memcpy(pcVar11,local_68[2],local_80);
      pFVar25 = local_a0;
      pFVar14 = local_d0;
      pcVar11 = pcVar11 + sVar7;
      local_d0->zDb = pcVar11;
      memcpy(pcVar11,ppcVar22[1],(size_t)local_a0);
      puVar9 = local_e0;
      local_68 = (char **)(local_78 & 0xffffffff);
      if (0 < iVar6) {
        pcVar11 = pcVar11 + (long)pFVar25;
        local_a0 = (Fts3Hash *)((ulong)local_c0 & 0xffffffff);
        lVar10 = 0;
        do {
          local_a8 = (sqlite3_stmt *)((ulong)local_a8 & 0xffffffff00000000);
          pcVar15 = sqlite3Fts3NextToken((char *)puVar9[lVar10],(int *)&local_a8);
          sVar7 = (size_t)(int)local_a8;
          if (0 < (long)sVar7) {
            memcpy(pcVar11,pcVar15,sVar7);
          }
          pcVar11[sVar7] = '\0';
          sqlite3Fts3Dequote(pcVar11);
          pFVar14->azColumn[lVar10] = pcVar11;
          pcVar11 = pcVar11 + sVar7 + 1;
          lVar10 = lVar10 + 1;
        } while (local_a0 != (Fts3Hash *)lVar10);
        if (0 < (int)(uint)local_c0) {
          lVar10 = 0;
          do {
            sVar7 = strlen(pFVar14->azColumn[lVar10]);
            if (0 < (int)local_78) {
              iVar5 = (int)sVar7;
              local_c0 = (char *)CONCAT44(local_c0._4_4_,iVar5 + 1);
              ppcVar22 = (char **)0x0;
              do {
                pcVar11 = *(char **)((long)__s + (long)ppcVar22 * 8);
                if (((pcVar11 != (char *)0x0) && (sVar7 = strlen(pcVar11), iVar5 == (int)sVar7)) &&
                   (local_d0->azColumn[lVar10] != (char *)0x0)) {
                  if (0 < iVar5) {
                    lVar17 = 0;
                    uVar19 = (uint)local_c0;
                    do {
                      uVar26 = (ulong)(byte)local_d0->azColumn[lVar10][lVar17];
                      if (uVar26 == 0) {
                        uVar18 = ""[(byte)pcVar11[lVar17]];
                        uVar23 = '\0';
LAB_001bc061:
                        if (uVar23 != uVar18) goto LAB_001bc086;
                        break;
                      }
                      uVar23 = ""[uVar26];
                      uVar18 = ""[(byte)pcVar11[lVar17]];
                      if (uVar23 != uVar18) goto LAB_001bc061;
                      uVar19 = uVar19 - 1;
                      lVar17 = lVar17 + 1;
                    } while (1 < uVar19);
                  }
                  local_d0->abNotindexed[lVar10] = '\x01';
                  sqlite3_free(pcVar11);
                  *(undefined8 *)((long)__s + (long)ppcVar22 * 8) = 0;
                }
LAB_001bc086:
                ppcVar22 = (char **)((long)ppcVar22 + 1);
              } while (ppcVar22 != local_68);
            }
            lVar10 = lVar10 + 1;
            pFVar14 = local_d0;
          } while ((Fts3Hash *)lVar10 != local_a0);
        }
      }
      pcVar11 = local_d8;
      if ((int)local_78 < 1) {
        local_e4 = 0;
LAB_001bc20c:
        if ((pcVar11 != (char *)0x0) == (local_c8 == (char *)0x0)) {
          pcVar15 = "uncompress";
          if (local_c8 == (char *)0x0) {
            pcVar15 = "compress";
          }
          local_e4 = 1;
          sqlite3Fts3ErrMsg(pzErr,"missing %s parameter in fts4 constructor",pcVar15);
        }
      }
      else {
        ppcVar22 = (char **)0x0;
        iVar5 = 0;
        do {
          if (*(long *)((long)__s + (long)ppcVar22 * 8) != 0) {
            sqlite3Fts3ErrMsg(pzErr,"no such column: %s");
            iVar5 = 1;
          }
          ppcVar22 = (char **)((long)ppcVar22 + 1);
        } while (local_68 != ppcVar22);
        local_e4 = iVar5;
        if (iVar5 == 0) goto LAB_001bc20c;
      }
      local_a8 = (sqlite3_stmt *)0x0;
      if (pFVar14->zContentTbl == (char *)0x0) {
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar15 = fts3QuoteId(pcVar11);
          pcVar11 = pcVar15;
        }
        fts3Appendf(&local_e4,(char **)&local_a8,"docid");
        psVar27 = local_98;
        if (0 < pFVar14->nColumn) {
          uVar26 = 0;
          do {
            fts3Appendf(&local_e4,(char **)&local_a8,",%s(x.\'c%d%q\')",pcVar11,uVar26 & 0xffffffff,
                        pFVar14->azColumn[uVar26]);
            uVar26 = uVar26 + 1;
          } while ((long)uVar26 < (long)pFVar14->nColumn);
        }
        if (pFVar14->zLanguageid != (char *)0x0) {
          fts3Appendf(&local_e4,(char **)&local_a8,", x.%Q","langid");
        }
        sqlite3_free(pcVar15);
      }
      else {
        fts3Appendf(&local_e4,(char **)&local_a8,"rowid");
        if (0 < pFVar14->nColumn) {
          lVar10 = 0;
          do {
            fts3Appendf(&local_e4,(char **)&local_a8,", x.\'%q\'",pFVar14->azColumn[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pFVar14->nColumn);
        }
        psVar27 = local_98;
        if (pFVar14->zLanguageid != (char *)0x0) {
          fts3Appendf(&local_e4,(char **)&local_a8,", x.%Q");
        }
      }
      pcVar15 = "";
      pcVar11 = pFVar14->zContentTbl;
      pcVar13 = "";
      if (pcVar11 == (char *)0x0) {
        pcVar11 = pFVar14->zName;
        pcVar13 = "_content";
      }
      fts3Appendf(&local_e4,(char **)&local_a8," FROM \'%q\'.\'%q%s\' AS x",pFVar14->zDb,pcVar11,
                  pcVar13);
      pFVar14->zReadExprlist = (char *)local_a8;
      local_a8 = (sqlite3_stmt *)0x0;
      if (local_c8 == (char *)0x0) {
        local_c0 = (char *)0x0;
      }
      else {
        pcVar15 = fts3QuoteId(local_c8);
        local_c0 = pcVar15;
      }
      fts3Appendf(&local_e4,(char **)&local_a8,"?");
      if (0 < pFVar14->nColumn) {
        iVar5 = 0;
        do {
          fts3Appendf(&local_e4,(char **)&local_a8,",%s(?)",pcVar15);
          iVar5 = iVar5 + 1;
        } while (iVar5 < pFVar14->nColumn);
      }
      if (pFVar14->zLanguageid != (char *)0x0) {
        fts3Appendf(&local_e4,(char **)&local_a8,", ?");
      }
      sqlite3_free(local_c0);
      pcVar11 = local_d8;
      pFVar14->zWriteExprlist = (char *)local_a8;
      if (local_e4 == 0) {
        if (local_44 == 0) {
          if (cVar1 != '4') {
            pFVar14->bHasStat = '\x02';
          }
        }
        else {
          local_e4 = fts3CreateTables(pFVar14);
        }
        fts3DatabasePageSize(&local_e4,pFVar14);
        pFVar14->nNodeSize = pFVar14->nPgsz + -0x23;
        fts3DeclareVtab(&local_e4,pFVar14);
        pcVar15 = local_b8;
        pcVar13 = (char *)0x0;
        pcVar21 = (char *)0x0;
        p = local_c8;
      }
      else {
        pcVar15 = local_b8;
        pcVar13 = (char *)0x0;
        pcVar21 = (char *)0x0;
        p = local_c8;
      }
      goto LAB_001bb351;
    }
  }
  local_e4 = 7;
  local_d0 = (Fts3Table *)0x0;
  pcVar15 = local_b8;
  pcVar13 = local_90;
  pcVar11 = local_d8;
  psVar27 = local_98;
  pcVar21 = local_88;
  p = local_c8;
  goto LAB_001bb351;
LAB_001bc644:
  pcVar21 = pcVar21 + 1;
  if (pcVar11 == pcVar21) goto LAB_001bc6cf;
  goto LAB_001bc627;
}

Assistant:

static int fts3InitVtab(
  int isCreate,                   /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts3Hash *pHash = (Fts3Hash *)pAux;
  Fts3Table *p = 0;               /* Pointer to allocated vtab */
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Iterator variable */
  sqlite3_int64 nByte;            /* Size of allocation used for *p */
  int iCol;                       /* Column index */
  int nString = 0;                /* Bytes required to hold all column names */
  int nCol = 0;                   /* Number of columns in the FTS table */
  char *zCsr;                     /* Space for holding column names */
  int nDb;                        /* Bytes required to hold database name */
  int nName;                      /* Bytes required to hold table name */
  int isFts4 = (argv[0][3]=='4'); /* True for FTS4, false for FTS3 */
  const char **aCol;              /* Array of column names */
  sqlite3_tokenizer *pTokenizer = 0;        /* Tokenizer for this table */

  int nIndex = 0;                 /* Size of aIndex[] array */
  struct Fts3Index *aIndex = 0;   /* Array of indexes for this table */

  /* The results of parsing supported FTS4 key=value options: */
  int bNoDocsize = 0;             /* True to omit %_docsize table */
  int bDescIdx = 0;               /* True to store descending indexes */
  char *zPrefix = 0;              /* Prefix parameter value (or NULL) */
  char *zCompress = 0;            /* compress=? parameter (or NULL) */
  char *zUncompress = 0;          /* uncompress=? parameter (or NULL) */
  char *zContent = 0;             /* content=? parameter (or NULL) */
  char *zLanguageid = 0;          /* languageid=? parameter (or NULL) */
  char **azNotindexed = 0;        /* The set of notindexed= columns */
  int nNotindexed = 0;            /* Size of azNotindexed[] array */

  assert( strlen(argv[0])==4 );
  assert( (sqlite3_strnicmp(argv[0], "fts4", 4)==0 && isFts4)
       || (sqlite3_strnicmp(argv[0], "fts3", 4)==0 && !isFts4)
  );

  nDb = (int)strlen(argv[1]) + 1;
  nName = (int)strlen(argv[2]) + 1;

  nByte = sizeof(const char *) * (argc-2);
  aCol = (const char **)sqlite3_malloc64(nByte);
  if( aCol ){
    memset((void*)aCol, 0, nByte);
    azNotindexed = (char **)sqlite3_malloc64(nByte);
  }
  if( azNotindexed ){
    memset(azNotindexed, 0, nByte);
  }
  if( !aCol || !azNotindexed ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }

  /* Loop through all of the arguments passed by the user to the FTS3/4
  ** module (i.e. all the column names and special arguments). This loop
  ** does the following:
  **
  **   + Figures out the number of columns the FTSX table will have, and
  **     the number of bytes of space that must be allocated to store copies
  **     of the column names.
  **
  **   + If there is a tokenizer specification included in the arguments,
  **     initializes the tokenizer pTokenizer.
  */
  for(i=3; rc==SQLITE_OK && i<argc; i++){
    char const *z = argv[i];
    int nKey;
    char *zVal;

    /* Check if this is a tokenizer specification */
    if( !pTokenizer 
     && strlen(z)>8
     && 0==sqlite3_strnicmp(z, "tokenize", 8) 
     && 0==sqlite3Fts3IsIdChar(z[8])
    ){
      rc = sqlite3Fts3InitTokenizer(pHash, &z[9], &pTokenizer, pzErr);
    }

    /* Check if it is an FTS4 special argument. */
    else if( isFts4 && fts3IsSpecialColumn(z, &nKey, &zVal) ){
      struct Fts4Option {
        const char *zOpt;
        int nOpt;
      } aFts4Opt[] = {
        { "matchinfo",   9 },     /* 0 -> MATCHINFO */
        { "prefix",      6 },     /* 1 -> PREFIX */
        { "compress",    8 },     /* 2 -> COMPRESS */
        { "uncompress", 10 },     /* 3 -> UNCOMPRESS */
        { "order",       5 },     /* 4 -> ORDER */
        { "content",     7 },     /* 5 -> CONTENT */
        { "languageid", 10 },     /* 6 -> LANGUAGEID */
        { "notindexed", 10 }      /* 7 -> NOTINDEXED */
      };

      int iOpt;
      if( !zVal ){
        rc = SQLITE_NOMEM;
      }else{
        for(iOpt=0; iOpt<SizeofArray(aFts4Opt); iOpt++){
          struct Fts4Option *pOp = &aFts4Opt[iOpt];
          if( nKey==pOp->nOpt && !sqlite3_strnicmp(z, pOp->zOpt, pOp->nOpt) ){
            break;
          }
        }
        switch( iOpt ){
          case 0:               /* MATCHINFO */
            if( strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "fts3", 4) ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized matchinfo: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bNoDocsize = 1;
            break;

          case 1:               /* PREFIX */
            sqlite3_free(zPrefix);
            zPrefix = zVal;
            zVal = 0;
            break;

          case 2:               /* COMPRESS */
            sqlite3_free(zCompress);
            zCompress = zVal;
            zVal = 0;
            break;

          case 3:               /* UNCOMPRESS */
            sqlite3_free(zUncompress);
            zUncompress = zVal;
            zVal = 0;
            break;

          case 4:               /* ORDER */
            if( (strlen(zVal)!=3 || sqlite3_strnicmp(zVal, "asc", 3)) 
             && (strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "desc", 4)) 
            ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized order: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bDescIdx = (zVal[0]=='d' || zVal[0]=='D');
            break;

          case 5:              /* CONTENT */
            sqlite3_free(zContent);
            zContent = zVal;
            zVal = 0;
            break;

          case 6:              /* LANGUAGEID */
            assert( iOpt==6 );
            sqlite3_free(zLanguageid);
            zLanguageid = zVal;
            zVal = 0;
            break;

          case 7:              /* NOTINDEXED */
            azNotindexed[nNotindexed++] = zVal;
            zVal = 0;
            break;

          default:
            assert( iOpt==SizeofArray(aFts4Opt) );
            sqlite3Fts3ErrMsg(pzErr, "unrecognized parameter: %s", z);
            rc = SQLITE_ERROR;
            break;
        }
        sqlite3_free(zVal);
      }
    }

    /* Otherwise, the argument is a column name. */
    else {
      nString += (int)(strlen(z) + 1);
      aCol[nCol++] = z;
    }
  }

  /* If a content=xxx option was specified, the following:
  **
  **   1. Ignore any compress= and uncompress= options.
  **
  **   2. If no column names were specified as part of the CREATE VIRTUAL
  **      TABLE statement, use all columns from the content table.
  */
  if( rc==SQLITE_OK && zContent ){
    sqlite3_free(zCompress); 
    sqlite3_free(zUncompress); 
    zCompress = 0;
    zUncompress = 0;
    if( nCol==0 ){
      sqlite3_free((void*)aCol); 
      aCol = 0;
      rc = fts3ContentColumns(db, argv[1], zContent,&aCol,&nCol,&nString,pzErr);

      /* If a languageid= option was specified, remove the language id
      ** column from the aCol[] array. */ 
      if( rc==SQLITE_OK && zLanguageid ){
        int j;
        for(j=0; j<nCol; j++){
          if( sqlite3_stricmp(zLanguageid, aCol[j])==0 ){
            int k;
            for(k=j; k<nCol; k++) aCol[k] = aCol[k+1];
            nCol--;
            break;
          }
        }
      }
    }
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  if( nCol==0 ){
    assert( nString==0 );
    aCol[0] = "content";
    nString = 8;
    nCol = 1;
  }

  if( pTokenizer==0 ){
    rc = sqlite3Fts3InitTokenizer(pHash, "simple", &pTokenizer, pzErr);
    if( rc!=SQLITE_OK ) goto fts3_init_out;
  }
  assert( pTokenizer );

  rc = fts3PrefixParameter(zPrefix, &nIndex, &aIndex);
  if( rc==SQLITE_ERROR ){
    assert( zPrefix );
    sqlite3Fts3ErrMsg(pzErr, "error parsing prefix parameter: %s", zPrefix);
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* Allocate and populate the Fts3Table structure. */
  nByte = sizeof(Fts3Table) +                  /* Fts3Table */
          nCol * sizeof(char *) +              /* azColumn */
          nIndex * sizeof(struct Fts3Index) +  /* aIndex */
          nCol * sizeof(u8) +                  /* abNotindexed */
          nName +                              /* zName */
          nDb +                                /* zDb */
          nString;                             /* Space for azColumn strings */
  p = (Fts3Table*)sqlite3_malloc64(nByte);
  if( p==0 ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }
  memset(p, 0, nByte);
  p->db = db;
  p->nColumn = nCol;
  p->nPendingData = 0;
  p->azColumn = (char **)&p[1];
  p->pTokenizer = pTokenizer;
  p->nMaxPendingData = FTS3_MAX_PENDING_DATA;
  p->bHasDocsize = (isFts4 && bNoDocsize==0);
  p->bHasStat = (u8)isFts4;
  p->bFts4 = (u8)isFts4;
  p->bDescIdx = (u8)bDescIdx;
  p->nAutoincrmerge = 0xff;   /* 0xff means setting unknown */
  p->zContentTbl = zContent;
  p->zLanguageid = zLanguageid;
  zContent = 0;
  zLanguageid = 0;
  TESTONLY( p->inTransaction = -1 );
  TESTONLY( p->mxSavepoint = -1 );

  p->aIndex = (struct Fts3Index *)&p->azColumn[nCol];
  memcpy(p->aIndex, aIndex, sizeof(struct Fts3Index) * nIndex);
  p->nIndex = nIndex;
  for(i=0; i<nIndex; i++){
    fts3HashInit(&p->aIndex[i].hPending, FTS3_HASH_STRING, 1);
  }
  p->abNotindexed = (u8 *)&p->aIndex[nIndex];

  /* Fill in the zName and zDb fields of the vtab structure. */
  zCsr = (char *)&p->abNotindexed[nCol];
  p->zName = zCsr;
  memcpy(zCsr, argv[2], nName);
  zCsr += nName;
  p->zDb = zCsr;
  memcpy(zCsr, argv[1], nDb);
  zCsr += nDb;

  /* Fill in the azColumn array */
  for(iCol=0; iCol<nCol; iCol++){
    char *z; 
    int n = 0;
    z = (char *)sqlite3Fts3NextToken(aCol[iCol], &n);
    if( n>0 ){
      memcpy(zCsr, z, n);
    }
    zCsr[n] = '\0';
    sqlite3Fts3Dequote(zCsr);
    p->azColumn[iCol] = zCsr;
    zCsr += n+1;
    assert( zCsr <= &((char *)p)[nByte] );
  }

  /* Fill in the abNotindexed array */
  for(iCol=0; iCol<nCol; iCol++){
    int n = (int)strlen(p->azColumn[iCol]);
    for(i=0; i<nNotindexed; i++){
      char *zNot = azNotindexed[i];
      if( zNot && n==(int)strlen(zNot)
       && 0==sqlite3_strnicmp(p->azColumn[iCol], zNot, n) 
      ){
        p->abNotindexed[iCol] = 1;
        sqlite3_free(zNot);
        azNotindexed[i] = 0;
      }
    }
  }
  for(i=0; i<nNotindexed; i++){
    if( azNotindexed[i] ){
      sqlite3Fts3ErrMsg(pzErr, "no such column: %s", azNotindexed[i]);
      rc = SQLITE_ERROR;
    }
  }

  if( rc==SQLITE_OK && (zCompress==0)!=(zUncompress==0) ){
    char const *zMiss = (zCompress==0 ? "compress" : "uncompress");
    rc = SQLITE_ERROR;
    sqlite3Fts3ErrMsg(pzErr, "missing %s parameter in fts4 constructor", zMiss);
  }
  p->zReadExprlist = fts3ReadExprList(p, zUncompress, &rc);
  p->zWriteExprlist = fts3WriteExprList(p, zCompress, &rc);
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* If this is an xCreate call, create the underlying tables in the 
  ** database. TODO: For xConnect(), it could verify that said tables exist.
  */
  if( isCreate ){
    rc = fts3CreateTables(p);
  }

  /* Check to see if a legacy fts3 table has been "upgraded" by the
  ** addition of a %_stat table so that it can use incremental merge.
  */
  if( !isFts4 && !isCreate ){
    p->bHasStat = 2;
  }

  /* Figure out the page-size for the database. This is required in order to
  ** estimate the cost of loading large doclists from the database.  */
  fts3DatabasePageSize(&rc, p);
  p->nNodeSize = p->nPgsz-35;

  /* Declare the table schema to SQLite. */
  fts3DeclareVtab(&rc, p);

fts3_init_out:
  sqlite3_free(zPrefix);
  sqlite3_free(aIndex);
  sqlite3_free(zCompress);
  sqlite3_free(zUncompress);
  sqlite3_free(zContent);
  sqlite3_free(zLanguageid);
  for(i=0; i<nNotindexed; i++) sqlite3_free(azNotindexed[i]);
  sqlite3_free((void *)aCol);
  sqlite3_free((void *)azNotindexed);
  if( rc!=SQLITE_OK ){
    if( p ){
      fts3DisconnectMethod((sqlite3_vtab *)p);
    }else if( pTokenizer ){
      pTokenizer->pModule->xDestroy(pTokenizer);
    }
  }else{
    assert( p->pSegments==0 );
    *ppVTab = &p->base;
  }
  return rc;
}